

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall R2Rect::Contains(R2Rect *this,R2Point *p)

{
  byte bVar1;
  
  bVar1 = 0;
  if ((this->bounds_[0].bounds_.c_[0] <= p->c_[0]) &&
     (bVar1 = 0, p->c_[0] <= this->bounds_[0].bounds_.c_[1])) {
    bVar1 = -(p->c_[1] <= this->bounds_[1].bounds_.c_[1]) &
            -(this->bounds_[1].bounds_.c_[0] <= p->c_[1]);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

T x() const { return c_[0]; }